

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_record_book_save_on_use.hpp
# Opt level: O1

uint32_t __thiscall
PatchRecordBookSaveOnUse::inject_use_record_book_function(PatchRecordBookSaveOnUse *this,ROM *rom)

{
  uint32_t uVar1;
  initializer_list<md::DataRegister> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<md::DataRegister> __l_01;
  Code func_use_record_book;
  allocator_type local_111;
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_f0;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_d8;
  Code local_b8;
  AddressRegister local_40;
  
  local_b8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_b8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_b8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_b8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110._0_8_ = &PTR_getXn_00261bb0;
  local_100._M_local_buf[8] = '\x01';
  local_100._M_allocated_capacity = (size_type)&PTR_getXn_00261bb0;
  __l._M_len = 2;
  __l._M_array = (iterator)local_110;
  local_b8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_b8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector(&local_f0,__l,&local_111)
  ;
  local_d8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.super_Register._code = '\a';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  md::Code::movem(&local_b8,&local_f0,&local_d8,true,&local_40,LONG);
  if (local_d8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (this->_consumable_record_book == true) {
    local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
    local_110._0_8_ = &PTR_getXn_00261bb0;
    local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261cd8;
    local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x200ff1152;
    md::Code::move(&local_b8,(Param *)local_110,(Param *)&local_f0,BYTE);
    local_110._0_8_ = &PTR_getXn_00261cd8;
    local_110._8_8_ = (pointer)0x200008b98;
    md::Code::jsr(&local_b8,(Param *)local_110);
  }
  local_110._0_8_ = &PTR_getXn_00261cd8;
  local_110._8_8_ = (pointer)0x200ff1204;
  local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_f0.
                        super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  md::Code::move(&local_b8,(Param *)local_110,(Param *)&local_f0,WORD);
  local_110._0_8_ = &PTR_getXn_00261cd8;
  local_110._8_8_ = (pointer)0x200ff5400;
  local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT71(local_f0.
                         super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                         _M_impl.super__Vector_impl_data._M_finish._1_7_,1);
  local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261bb0;
  md::Code::move(&local_b8,(Param *)local_110,(Param *)&local_f0,WORD);
  local_110._0_8_ = &PTR_getXn_00261cd8;
  local_110._8_8_ = (pointer)0x200ff0018;
  local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261cd8;
  local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff1204;
  md::Code::move(&local_b8,(Param *)local_110,(Param *)&local_f0,WORD);
  local_110._0_8_ = &PTR_getXn_00261cd8;
  local_110._8_8_ = (pointer)0x200ff001a;
  local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261cd8;
  local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff5400;
  md::Code::move(&local_b8,(Param *)local_110,(Param *)&local_f0,WORD);
  local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_f0.
                         super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                         _M_impl.super__Vector_impl_data._M_start._2_6_,0x700);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_f0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110,__l_00,
             (allocator_type *)&local_d8);
  md::Code::trap(&local_b8,'\0',(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110);
  if ((_func_int **)local_110._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_110._0_8_,local_100._M_allocated_capacity - local_110._0_8_);
  }
  local_110._0_8_ = &PTR_getXn_00261cd8;
  local_110._8_8_ = (pointer)0x200029046;
  md::Code::jsr(&local_b8,(Param *)local_110);
  md::Code::add_word(&local_b8,0);
  local_110._0_8_ = &PTR_getXn_00261cd8;
  local_110._8_8_ = (pointer)0x200000852;
  md::Code::jsr(&local_b8,(Param *)local_110);
  local_110._0_8_ = &PTR_getXn_00261cd8;
  local_110._8_8_ = (pointer)0x200001592;
  md::Code::jsr(&local_b8,(Param *)local_110);
  local_110._8_8_ = local_110._8_8_ & 0xffffffffffffff00;
  local_110._0_8_ = &PTR_getXn_00261bb0;
  local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261cd8;
  local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff1204;
  md::Code::move(&local_b8,(Param *)local_110,(Param *)&local_f0,WORD);
  local_110[8] = '\x01';
  local_110._0_8_ = &PTR_getXn_00261bb0;
  local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_getXn_00261cd8;
  local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x200ff5400;
  md::Code::move(&local_b8,(Param *)local_110,(Param *)&local_f0,WORD);
  local_110._8_8_ = (ulong)(uint7)local_110._9_7_ << 8;
  local_110._0_8_ = &PTR_getXn_00261bb0;
  local_100._M_local_buf[8] = '\x01';
  local_100._M_allocated_capacity = (size_type)&PTR_getXn_00261bb0;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_110;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_f0,__l_01,&local_111);
  local_d8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.super_Register._code = '\a';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00261c50;
  md::Code::movem(&local_b8,&local_f0,&local_d8,false,&local_40,LONG);
  if (local_d8.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f0.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_110._0_8_ = &PTR_getXn_00261cd8;
  local_110._8_8_ = (pointer)0x200008bba;
  md::Code::jmp(&local_b8,(Param *)local_110);
  local_110._0_8_ = &local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"");
  uVar1 = md::ROM::inject_code(rom,&local_b8,(string *)local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._0_8_ != &local_100) {
    operator_delete((void *)local_110._0_8_,local_100._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_b8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_b8._pending_branches._M_t);
  if (local_b8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar1;
}

Assistant:

uint32_t inject_use_record_book_function(md::ROM& rom) const
    {
        // -------- Function to save game using record book --------
        // On record book use, set stored position and map as current to fool the save_game function, then call it
        // to save the game with this map and position. Then, restore Nigel's position and map as if nothing happened.

        md::Code func_use_record_book;
        func_use_record_book.movem_to_stack({ reg_D0, reg_D1 }, {});

        if(_consumable_record_book)
        {
            func_use_record_book.moveb(reg_D0, addr_(0xFF1152));
            func_use_record_book.jsr(0x8B98); // ConsumeItem
        }

        func_use_record_book.movew(addr_(0xFF1204), reg_D0);
        func_use_record_book.movew(addr_(0xFF5400), reg_D1);

        func_use_record_book.movew(addr_(MAP_ENTRANCE_POSITION_ADDRESS), addr_(0xFF1204));
        func_use_record_book.movew(addr_(MAP_ENTRANCE_POSITION_ADDRESS+2), addr_(0xFF5400));

        func_use_record_book.trap(0, { 0x00, 0x07 }); // Play save game music
        func_use_record_book.jsr(0x29046); // Sleep_0 for 0x17 frames
        func_use_record_book.add_word(0x0000);
        func_use_record_book.jsr(0x852); // Restore BGM

        func_use_record_book.jsr(0x1592); // Save game to SRAM

        func_use_record_book.movew(reg_D0, addr_(0xFF1204));
        func_use_record_book.movew(reg_D1, addr_(0xFF5400));
        func_use_record_book.movem_from_stack({ reg_D0, reg_D1 }, {});

        func_use_record_book.jmp(offsets::PROC_ITEM_USE_RETURN_SUCCESS);

        return rom.inject_code(func_use_record_book);
    }